

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

date_t duckdb::MakeDateOperator::Operation<long,long,long,duckdb::date_t>(long yyyy,long mm,long dd)

{
  int year;
  int month;
  int day;
  date_t dVar1;
  
  year = Cast::Operation<long,int>(yyyy);
  month = Cast::Operation<long,int>(mm);
  day = Cast::Operation<long,int>(dd);
  dVar1 = Date::FromDate(year,month,day);
  return (date_t)dVar1.days;
}

Assistant:

static RESULT_TYPE Operation(YYYY yyyy, MM mm, DD dd) {
		return Date::FromDate(Cast::Operation<YYYY, int32_t>(yyyy), Cast::Operation<MM, int32_t>(mm),
		                      Cast::Operation<DD, int32_t>(dd));
	}